

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_wait_release.h
# Opt level: O1

bool __thiscall kmp_flag_oncore::notdone_check(kmp_flag_oncore *this)

{
  bool bVar1;
  long lVar2;
  kmp_flag_64 flag;
  kmp_flag_64 local_28;
  
  lVar2 = (ulong)this->bt * 0xc0;
  if (this->this_thr->th_pad[lVar2 + 0x23f] == '\x03') {
    this->flag_switch = true;
  }
  if ((*(char *)((long)(this->super_kmp_flag<unsigned_long_long>).loc + (ulong)this->offset) ==
       '\x01') || (bVar1 = true, this->flag_switch == true)) {
    if (this->flag_switch != true) {
      return false;
    }
    this->this_thr->th_pad[lVar2 + 0x23f] = '\x04';
    local_28.super_kmp_basic_flag<unsigned_long_long>.super_kmp_flag<unsigned_long_long>.loc =
         (unsigned_long_long *)((long)this->this_thr + (ulong)this->bt * 0xc0 + 0x1f0);
    local_28.super_kmp_basic_flag<unsigned_long_long>.super_kmp_flag<unsigned_long_long>.t = flag64;
    local_28.super_kmp_basic_flag<unsigned_long_long>.checker = 4;
    local_28.super_kmp_basic_flag<unsigned_long_long>.num_waiting_threads = 0;
    __kmp_wait_64(this->this_thr,&local_28,1,this->itt_sync_obj);
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool notdone_check() {
    // Calculate flag_switch
    if (this_thr->th.th_bar[bt].bb.wait_flag == KMP_BARRIER_SWITCH_TO_OWN_FLAG)
      flag_switch = true;
    if (byteref(get(), offset) != 1 && !flag_switch)
      return true;
    else if (flag_switch) {
      this_thr->th.th_bar[bt].bb.wait_flag = KMP_BARRIER_SWITCHING;
      kmp_flag_64 flag(&this_thr->th.th_bar[bt].bb.b_go,
                       (kmp_uint64)KMP_BARRIER_STATE_BUMP);
      __kmp_wait_64(this_thr, &flag, TRUE
#if USE_ITT_BUILD
                    ,
                    itt_sync_obj
#endif
                    );
    }
    return false;
  }